

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatten.hpp
# Opt level: O0

basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>
jsoncons::jsonpath::flatten<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
          (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *value)

{
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar1;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_RDI;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> bVar2;
  string_type parent_key;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *result;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_00000130;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_00000138;
  string_type *in_stack_00000140;
  allocator<char> local_4a;
  undefined1 local_49;
  undefined1 *local_48;
  undefined8 local_40;
  string local_38 [39];
  byte local_11;
  
  local_11 = 0;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::basic_json(in_RDI);
  local_49 = 0x24;
  local_48 = &local_49;
  local_40 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,local_48,local_40,&local_4a);
  std::allocator<char>::~allocator(&local_4a);
  flatten_<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
            (in_stack_00000140,in_stack_00000138,in_stack_00000130);
  local_11 = 1;
  std::__cxx11::string::~string(local_38);
  uVar1 = extraout_RDX;
  if ((local_11 & 1) == 0) {
    basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::~basic_json
              ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)0x55e2fa);
    uVar1 = extraout_RDX_00;
  }
  bVar2.field_0.int64_.val_ = uVar1;
  bVar2.field_0._0_8_ = in_RDI;
  return (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>)bVar2.field_0;
}

Assistant:

Json flatten(const Json& value)
    {
        Json result;
        typename Json::string_type parent_key = {'$'};
        flatten_(parent_key, value, result);
        return result;
    }